

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateRecorder::Impl::remap_graphics_pipeline_ci
          (Impl *this,VkGraphicsPipelineCreateInfo *info)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  VkBaseInStructure *base_in;
  int *piVar4;
  
  bVar1 = remap_render_pass_handle(this,info->renderPass,&info->renderPass);
  if (!bVar1) {
    return false;
  }
  bVar1 = remap_pipeline_layout_handle(this,info->layout,&info->layout);
  if (!bVar1) {
    return false;
  }
  piVar4 = (int *)info->pNext;
  do {
    if (piVar4 == (int *)0x0) {
LAB_0012dfc6:
      if ((info->basePipelineHandle != (VkPipeline)0x0) &&
         (bVar1 = remap_graphics_pipeline_handle
                            (this,info->basePipelineHandle,&info->basePipelineHandle), !bVar1)) {
        return false;
      }
      bVar1 = remap_shader_module_handles<VkGraphicsPipelineCreateInfo>(this,info);
      return bVar1;
    }
    if (*piVar4 == 0x3b9f36d0) {
      if (piVar4[4] != 0) {
        lVar2 = 0;
        uVar3 = 0;
        do {
          bVar1 = remap_graphics_pipeline_handle
                            (this,*(VkPipeline *)(*(long *)(piVar4 + 6) + lVar2),
                             (VkPipeline *)(*(long *)(piVar4 + 6) + lVar2));
          if (!bVar1) {
            return false;
          }
          uVar3 = uVar3 + 1;
          lVar2 = lVar2 + 8;
        } while (uVar3 < (uint)piVar4[4]);
      }
      goto LAB_0012dfc6;
    }
    piVar4 = *(int **)(piVar4 + 2);
  } while( true );
}

Assistant:

bool StateRecorder::Impl::remap_graphics_pipeline_ci(VkGraphicsPipelineCreateInfo *info)
{
	if (!remap_render_pass_handle(info->renderPass, &info->renderPass))
		return false;
	if (!remap_pipeline_layout_handle(info->layout, &info->layout))
		return false;

	auto *library = find_pnext<VkPipelineLibraryCreateInfoKHR>(
			VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR, info->pNext);

	if (library)
	{
		for (uint32_t i = 0; i < library->libraryCount; i++)
			if (!remap_graphics_pipeline_handle(library->pLibraries[i], const_cast<VkPipeline *>(&library->pLibraries[i])))
				return false;
	}

	if (info->basePipelineHandle != VK_NULL_HANDLE)
		if (!remap_graphics_pipeline_handle(info->basePipelineHandle, &info->basePipelineHandle))
			return false;

	if (!remap_shader_module_handles(info))
		return false;

	return true;
}